

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int initializer(sym_t *s)

{
  node_t left;
  undefined8 in_RDI;
  bool bVar1;
  node_t n;
  node_t right;
  char *in_stack_ffffffffffffffe0;
  int id;
  uint local_4;
  
  id = (int)((ulong)in_RDI >> 0x20);
  left = assignment_expression();
  bVar1 = left != (node_t)0x0;
  if (bVar1) {
    identifier(in_stack_ffffffffffffffe0);
    binop(id,left,in_stack_ffffffffffffffe0);
    ast_add_node((node_t)0x10575d);
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int initializer(sym_t* s)
{
    node_t right = NULL;
    if ((right = assignment_expression()))
    {
        node_t n = binop('=', identifier(s->id), right);
        ast_add_node(n);
        return 1;
    }

    return 0;
}